

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.cpp
# Opt level: O3

void __thiscall
slang::ast::ValueSymbol::addDriver
          (ValueSymbol *this,DriverKind driverKind,DriverBitRange bounds,
          Expression *longestStaticPrefix,Symbol *containingSymbol,Expression *procCallExpression)

{
  undefined8 in_RAX;
  ValueDriver *driver;
  undefined8 uStack_28;
  
  uStack_28._0_7_ = (undefined7)in_RAX;
  uStack_28 = CONCAT17(driverKind,(undefined7)uStack_28) & 0xff00ffffffffffff;
  driver = BumpAllocator::
           emplace<slang::ast::ValueDriver,slang::ast::DriverKind&,slang::ast::Expression_const&,slang::ast::Symbol_const&,slang::ast::AssignFlags>
                     (&((this->super_Symbol).parentScope)->compilation->super_BumpAllocator,
                      (DriverKind *)((long)&uStack_28 + 7),longestStaticPrefix,containingSymbol,
                      (AssignFlags *)((long)&uStack_28 + 6));
  driver->procCallExpression = procCallExpression;
  addDriver(this,bounds,driver);
  return;
}

Assistant:

void ValueSymbol::addDriver(DriverKind driverKind, DriverBitRange bounds,
                            const Expression& longestStaticPrefix, const Symbol& containingSymbol,
                            const Expression& procCallExpression) const {
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    auto driver = comp.emplace<ValueDriver>(driverKind, longestStaticPrefix, containingSymbol,
                                            AssignFlags::None);
    driver->procCallExpression = &procCallExpression;

    addDriver(bounds, *driver);
}